

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_neon_addl(TCGContext_conflict1 *tcg_ctx,int size)

{
  TCGv_i64 pTVar1;
  code *func;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  if (size == 2) {
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_ctx->cpu_V0 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_V0 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_V1 + (long)tcg_ctx));
    return;
  }
  if (size == 1) {
    pTVar1 = tcg_ctx->cpu_V0;
    local_10 = tcg_ctx->cpu_V1;
    func = helper_neon_addl_u32_aarch64;
  }
  else {
    if (size != 0) {
      abort();
    }
    pTVar1 = tcg_ctx->cpu_V0;
    local_10 = tcg_ctx->cpu_V1;
    func = helper_neon_addl_u16_aarch64;
  }
  local_10 = local_10 + (long)tcg_ctx;
  local_18 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,func,local_18,2,&local_18);
  return;
}

Assistant:

static inline void gen_neon_addl(TCGContext *tcg_ctx, int size)
{
    switch (size) {
    case 0: gen_helper_neon_addl_u16(tcg_ctx, CPU_V001); break;
    case 1: gen_helper_neon_addl_u32(tcg_ctx, CPU_V001); break;
    case 2: tcg_gen_add_i64(tcg_ctx, CPU_V001); break;
    default: abort();
    }
}